

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::ContentEncoding::ParseContentEncodingEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader)

{
  bool bVar1;
  long lVar2;
  ContentCompression **ppCVar3;
  ContentEncryption **ppCVar4;
  ContentEncryption *encryption;
  unsigned_long_long uVar5;
  ulong uVar6;
  ContentEncoding *pCVar7;
  long unaff_R13;
  long stop;
  longlong pos;
  longlong size_1;
  longlong id;
  long local_70;
  long local_68;
  ContentEncoding *local_60;
  ulong local_58;
  ulong local_50;
  IMkvReader *local_48;
  long local_40;
  longlong local_38;
  
  local_60 = this;
  local_48 = pReader;
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x106c,
                  "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                 );
  }
  stop = size + start;
  local_58 = 0;
  local_50 = 0;
  local_70 = start;
  local_38 = start;
  while (pCVar7 = local_60, local_70 < stop) {
    lVar2 = ParseElementHeader(local_48,&local_70,stop,&local_40,&local_68);
    if (lVar2 < 0) {
      bVar1 = false;
    }
    else if ((local_40 == 0x5034) &&
            (uVar6 = local_50 + 1, bVar1 = 0x7ffffffe < (long)local_50, local_50 = uVar6, bVar1)) {
      bVar1 = false;
      lVar2 = -1;
    }
    else if ((local_40 == 0x5035) &&
            (uVar6 = local_58 + 1, bVar1 = 0x7ffffffe < (long)local_58, local_58 = uVar6, bVar1)) {
      bVar1 = false;
      lVar2 = -1;
    }
    else {
      local_70 = local_70 + local_68;
      bVar1 = local_70 <= stop;
      lVar2 = unaff_R13;
      if (stop < local_70) {
        lVar2 = -2;
      }
    }
    unaff_R13 = lVar2;
    if (!bVar1) {
      return lVar2;
    }
  }
  if ((long)local_50 < 1 && (long)local_58 < 1) {
    return -1;
  }
  if (0 < (long)local_50) {
    uVar6 = local_50 * 8;
    if (0x1fffffffffffffff < local_50) {
      uVar6 = 0xffffffffffffffff;
    }
    ppCVar3 = (ContentCompression **)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    pCVar7->compression_entries_ = ppCVar3;
    if (ppCVar3 == (ContentCompression **)0x0) {
      return -1;
    }
    local_60->compression_entries_end_ = ppCVar3;
  }
  pCVar7 = local_60;
  if (0 < (long)local_58) {
    uVar6 = 0xffffffffffffffff;
    if (local_58 < 0x2000000000000000) {
      uVar6 = local_58 * 8;
    }
    ppCVar4 = (ContentEncryption **)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    pCVar7->encryption_entries_ = ppCVar4;
    if (ppCVar4 == (ContentEncryption **)0x0) {
      if (pCVar7->compression_entries_ != (ContentCompression **)0x0) {
        operator_delete__(pCVar7->compression_entries_);
      }
      pCVar7->compression_entries_ = (ContentCompression **)0x0;
      return -1;
    }
    pCVar7->encryption_entries_end_ = ppCVar4;
  }
  local_70 = local_38;
  do {
    if (stop <= local_70) {
      return (ulong)(local_70 == stop) * 2 + -2;
    }
    lVar2 = ParseElementHeader(local_48,&local_70,stop,&local_40,&local_68);
    if (lVar2 < 0) {
      bVar1 = false;
      goto LAB_00116d2f;
    }
    lVar2 = unaff_R13;
    switch(local_40) {
    case 0x5031:
      uVar5 = UnserializeUInt(local_48,local_70,local_68);
      local_60->encoding_order_ = uVar5;
      break;
    case 0x5032:
      uVar5 = UnserializeUInt(local_48,local_70,local_68);
      local_60->encoding_scope_ = uVar5;
      if (uVar5 != 0) break;
      lVar2 = -1;
      goto LAB_00116d2d;
    case 0x5033:
      uVar5 = UnserializeUInt(local_48,local_70,local_68);
      local_60->encoding_type_ = uVar5;
      break;
    case 0x5034:
      pCVar7 = (ContentEncoding *)0x18;
      encryption = (ContentEncryption *)operator_new(0x18,(nothrow_t *)&std::nothrow);
      if (encryption == (ContentEncryption *)0x0) {
        encryption = (ContentEncryption *)0x0;
      }
      else {
        encryption->algo = 0;
        encryption->key_id = (uchar *)0x0;
        encryption->key_id_len = 0;
      }
      if (encryption == (ContentEncryption *)0x0) {
LAB_00116cd2:
        bVar1 = false;
        lVar2 = -1;
      }
      else {
        lVar2 = ParseCompressionEntry
                          (pCVar7,local_70,local_68,local_48,(ContentCompression *)encryption);
        if (lVar2 == 0) {
          if ((long)local_50 < 1) {
            __assert_fail("compression_count > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x10bc,
                          "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                         );
          }
          ppCVar3 = local_60->compression_entries_end_;
          local_60->compression_entries_end_ = ppCVar3 + 1;
          *ppCVar3 = (ContentCompression *)encryption;
          bVar1 = true;
          lVar2 = unaff_R13;
        }
        else {
          if (encryption->key_id != (uchar *)0x0) {
            operator_delete__(encryption->key_id);
          }
LAB_00116cc3:
          operator_delete(encryption);
          bVar1 = false;
        }
      }
      goto LAB_00116d04;
    case 0x5035:
      pCVar7 = (ContentEncoding *)0x50;
      encryption = (ContentEncryption *)operator_new(0x50,(nothrow_t *)&std::nothrow);
      if (encryption == (ContentEncryption *)0x0) {
        encryption = (ContentEncryption *)0x0;
      }
      else {
        encryption->sig_key_id_len = 0;
        encryption->sig_algo = 0;
        encryption->signature_len = 0;
        encryption->sig_key_id = (uchar *)0x0;
        encryption->key_id_len = 0;
        encryption->signature = (uchar *)0x0;
        encryption->algo = 0;
        encryption->key_id = (uchar *)0x0;
        encryption->sig_hash_algo = 0;
        (encryption->aes_settings).cipher_mode = 1;
      }
      if (encryption == (ContentEncryption *)0x0) goto LAB_00116cd2;
      lVar2 = ParseEncryptionEntry(pCVar7,local_70,local_68,local_48,encryption);
      if (lVar2 != 0) {
        ContentEncryption::~ContentEncryption(encryption);
        goto LAB_00116cc3;
      }
      if ((long)local_58 < 1) {
        __assert_fail("encryption_count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x10c9,
                      "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                     );
      }
      ppCVar4 = local_60->encryption_entries_end_;
      local_60->encryption_entries_end_ = ppCVar4 + 1;
      *ppCVar4 = encryption;
      bVar1 = true;
      lVar2 = unaff_R13;
LAB_00116d04:
      if (bVar1) break;
LAB_00116d2d:
      bVar1 = false;
      goto LAB_00116d2f;
    }
    local_70 = local_70 + local_68;
    bVar1 = local_70 <= stop;
    if (stop < local_70) {
      lVar2 = -2;
    }
LAB_00116d2f:
    unaff_R13 = lVar2;
    if (!bVar1) {
      return lVar2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseContentEncodingEntry(long long start, long long size,
                                                IMkvReader* pReader) {
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentCompression and ContentEncryption elements.
  long long compression_count = 0;
  long long encryption_count = 0;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompression) {
      ++compression_count;
      if (compression_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    if (id == libwebm::kMkvContentEncryption) {
      ++encryption_count;
      if (encryption_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (compression_count <= 0 && encryption_count <= 0)
    return -1;

  if (compression_count > 0) {
    compression_entries_ = new (std::nothrow)
        ContentCompression*[static_cast<size_t>(compression_count)];
    if (!compression_entries_)
      return -1;
    compression_entries_end_ = compression_entries_;
  }

  if (encryption_count > 0) {
    encryption_entries_ = new (std::nothrow)
        ContentEncryption*[static_cast<size_t>(encryption_count)];
    if (!encryption_entries_) {
      delete[] compression_entries_;
      compression_entries_ = NULL;
      return -1;
    }
    encryption_entries_end_ = encryption_entries_;
  }

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncodingOrder) {
      encoding_order_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncodingScope) {
      encoding_scope_ = UnserializeUInt(pReader, pos, size);
      if (encoding_scope_ < 1)
        return -1;
    } else if (id == libwebm::kMkvContentEncodingType) {
      encoding_type_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentCompression) {
      ContentCompression* const compression =
          new (std::nothrow) ContentCompression();
      if (!compression)
        return -1;

      status = ParseCompressionEntry(pos, size, pReader, compression);
      if (status) {
        delete compression;
        return status;
      }
      assert(compression_count > 0);
      *compression_entries_end_++ = compression;
    } else if (id == libwebm::kMkvContentEncryption) {
      ContentEncryption* const encryption =
          new (std::nothrow) ContentEncryption();
      if (!encryption)
        return -1;

      status = ParseEncryptionEntry(pos, size, pReader, encryption);
      if (status) {
        delete encryption;
        return status;
      }
      assert(encryption_count > 0);
      *encryption_entries_end_++ = encryption;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}